

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jasper.c
# Opt level: O3

cmdopts_t * cmdopts_parse(int argc,char **argv)

{
  int *piVar1;
  char *pcVar2;
  undefined4 uVar3;
  int iVar4;
  cmdopts_t *extraout_RAX;
  cmdopts_t *pcVar5;
  ulonglong uVar6;
  ulong extraout_RAX_00;
  void *__ptr;
  
  __ptr = (void *)0x2060;
  pcVar5 = (cmdopts_t *)malloc(0x2060);
  if (pcVar5 == (cmdopts_t *)0x0) {
<EXTERNAL>_free:
    cmdopts_parse_cold_5();
    free(__ptr);
    return extraout_RAX;
  }
  pcVar5->infile = (char *)0x0;
  pcVar5->infmt = -1;
  pcVar5->inopts = (char *)0x0;
  pcVar5->inoptsbuf[0] = '\0';
  pcVar5->outfile = (char *)0x0;
  piVar1 = &pcVar5->outfmt;
  pcVar5->outfmt = -1;
  pcVar5->outopts = (char *)0x0;
  pcVar5->outoptsbuf[0] = '\0';
  pcVar5->verbose = 0;
  pcVar5->debug = 0;
  pcVar5->version = 0;
  pcVar5->cmptno = -1;
  pcVar5->srgb = 0;
  do {
    __ptr = (void *)(ulong)(uint)argc;
    uVar3 = jas_getopt((void *)(ulong)(uint)argc,argv,cmdopts_parse::cmdoptions);
    pcVar2 = _jas_optarg;
    switch(uVar3) {
    case 0:
      cmdusage();
      goto <EXTERNAL>_free;
    case 1:
      pcVar5->verbose = 1;
      break;
    case 2:
      pcVar5->infile = _jas_optarg;
      break;
    case 3:
      iVar4 = jas_image_strtofmt(_jas_optarg);
      pcVar5->infmt = iVar4;
      if (iVar4 < 0) {
        fprintf(_stderr,"warning: ignoring invalid input format %s\n",pcVar2);
        pcVar5->infmt = -1;
      }
      break;
    case 4:
      addopt(pcVar5->inoptsbuf,0x1000,_jas_optarg);
      pcVar5->inopts = pcVar5->inoptsbuf;
      break;
    case 5:
      pcVar5->outfile = _jas_optarg;
      break;
    case 6:
      iVar4 = jas_image_strtofmt(_jas_optarg);
      *piVar1 = iVar4;
      if (iVar4 < 0) {
LAB_00102bba:
        cmdopts_parse_cold_1();
switchD_001029f6_default:
        badusage();
      }
      break;
    case 7:
      addopt(pcVar5->outoptsbuf,0x1000,_jas_optarg);
      pcVar5->outopts = pcVar5->outoptsbuf;
      break;
    case 8:
      pcVar5->version = 1;
      break;
    case 9:
      iVar4 = atoi(_jas_optarg);
      pcVar5->debug = iVar4;
      break;
    case 10:
      iVar4 = atoi(_jas_optarg);
      pcVar5->cmptno = (long)iVar4;
      break;
    case 0xb:
      pcVar5->srgb = 1;
      break;
    case 0xc:
      uVar6 = strtoull(_jas_optarg,(char **)0x0,10);
      pcVar5->max_mem = uVar6;
      break;
    case 0xffffffff:
      if (_jas_optind < argc) {
        cmdopts_parse_cold_2();
      }
      if ((pcVar5->version != 0) || (-1 < *piVar1)) {
        return pcVar5;
      }
      if (pcVar5->outfile != (char *)0x0) {
        iVar4 = jas_image_fmtfromname();
        *piVar1 = iVar4;
        if (-1 < iVar4) {
          return pcVar5;
        }
        cmdopts_parse_cold_3();
        if ((extraout_RAX_00 & 1) == 0) {
          return pcVar5;
        }
      }
      cmdopts_parse_cold_4();
      goto LAB_00102bba;
    default:
      goto switchD_001029f6_default;
    }
  } while( true );
}

Assistant:

cmdopts_t *cmdopts_parse(int argc, char **argv)
{
	enum {
		CMDOPT_HELP = 0,
		CMDOPT_VERBOSE,
		CMDOPT_INFILE,
		CMDOPT_INFMT,
		CMDOPT_INOPT,
		CMDOPT_OUTFILE,
		CMDOPT_OUTFMT,
		CMDOPT_OUTOPT,
		CMDOPT_VERSION,
		CMDOPT_DEBUG,
		CMDOPT_CMPTNO,
		CMDOPT_SRGB,
		CMDOPT_MAXMEM
	};

	static const jas_opt_t cmdoptions[] = {
		{CMDOPT_HELP, "help", 0},
		{CMDOPT_VERBOSE, "verbose", 0},
		{CMDOPT_INFILE, "input", JAS_OPT_HASARG},
		{CMDOPT_INFILE, "f", JAS_OPT_HASARG},
		{CMDOPT_INFMT, "input-format", JAS_OPT_HASARG},
		{CMDOPT_INFMT, "t", JAS_OPT_HASARG},
		{CMDOPT_INOPT, "input-option", JAS_OPT_HASARG},
		{CMDOPT_INOPT, "o", JAS_OPT_HASARG},
		{CMDOPT_OUTFILE, "output", JAS_OPT_HASARG},
		{CMDOPT_OUTFILE, "F", JAS_OPT_HASARG},
		{CMDOPT_OUTFMT, "output-format", JAS_OPT_HASARG},
		{CMDOPT_OUTFMT, "T", JAS_OPT_HASARG},
		{CMDOPT_OUTOPT, "output-option", JAS_OPT_HASARG},
		{CMDOPT_OUTOPT, "O", JAS_OPT_HASARG},
		{CMDOPT_VERSION, "version", 0},
		{CMDOPT_DEBUG, "debug-level", JAS_OPT_HASARG},
		{CMDOPT_CMPTNO, "cmptno", JAS_OPT_HASARG},
		{CMDOPT_SRGB, "force-srgb", 0},
		{CMDOPT_SRGB, "S", 0},
#if defined(JAS_DEFAULT_MAX_MEM_USAGE)
		{CMDOPT_MAXMEM, "memory-limit", JAS_OPT_HASARG},
#endif
		{-1, 0, 0}
	};

	cmdopts_t *cmdopts;
	int c;

	if (!(cmdopts = malloc(sizeof(cmdopts_t)))) {
		fprintf(stderr, "error: insufficient memory\n");
		exit(EXIT_FAILURE);
	}

	cmdopts->infile = 0;
	cmdopts->infmt = -1;
	cmdopts->inopts = 0;
	cmdopts->inoptsbuf[0] = '\0';
	cmdopts->outfile = 0;
	cmdopts->outfmt = -1;
	cmdopts->outopts = 0;
	cmdopts->outoptsbuf[0] = '\0';
	cmdopts->verbose = 0;
	cmdopts->version = 0;
	cmdopts->cmptno = -1;
	cmdopts->debug = 0;
	cmdopts->srgb = 0;
#if defined(JAS_DEFAULT_MAX_MEM_USAGE)
	cmdopts->max_mem = JAS_DEFAULT_MAX_MEM_USAGE;
#endif

	while ((c = jas_getopt(argc, argv, cmdoptions)) != EOF) {
		switch (c) {
		case CMDOPT_HELP:
			cmdusage();
			break;
		case CMDOPT_VERBOSE:
			cmdopts->verbose = 1;
			break;
		case CMDOPT_VERSION:
			cmdopts->version = 1;
			break;
		case CMDOPT_DEBUG:
			cmdopts->debug = atoi(jas_optarg);
			break;
		case CMDOPT_INFILE:
			cmdopts->infile = jas_optarg;
			break;
		case CMDOPT_INFMT:
			if ((cmdopts->infmt = jas_image_strtofmt(jas_optarg)) < 0) {
				fprintf(stderr, "warning: ignoring invalid input format %s\n",
				  jas_optarg);
				cmdopts->infmt = -1;
			}
			break;
		case CMDOPT_INOPT:
			addopt(cmdopts->inoptsbuf, OPTSMAX, jas_optarg);
			cmdopts->inopts = cmdopts->inoptsbuf;
			break;
		case CMDOPT_OUTFILE:
			cmdopts->outfile = jas_optarg;
			break;
		case CMDOPT_OUTFMT:
			if ((cmdopts->outfmt = jas_image_strtofmt(jas_optarg)) < 0) {
				fprintf(stderr, "error: invalid output format %s\n", jas_optarg);
				badusage();
			}
			break;
		case CMDOPT_OUTOPT:
			addopt(cmdopts->outoptsbuf, OPTSMAX, jas_optarg);
			cmdopts->outopts = cmdopts->outoptsbuf;
			break;
		case CMDOPT_CMPTNO:
			cmdopts->cmptno = atoi(jas_optarg);
			break;
		case CMDOPT_SRGB:
			cmdopts->srgb = 1;
			break;
		case CMDOPT_MAXMEM:
			cmdopts->max_mem = strtoull(jas_optarg, 0, 10);
			break;
		default:
			badusage();
			break;
		}
	}

	while (jas_optind < argc) {
		fprintf(stderr,
		  "warning: ignoring bogus command line argument %s\n",
		  argv[jas_optind]);
		++jas_optind;
	}

	if (cmdopts->version) {
		goto done;
	}

	if (cmdopts->outfmt < 0 && cmdopts->outfile) {
		if ((cmdopts->outfmt = jas_image_fmtfromname(cmdopts->outfile)) < 0) {
			fprintf(stderr,
			  "error: cannot guess image format from output file name\n");
		}
	}

	if (cmdopts->outfmt < 0) {
		fprintf(stderr, "error: no output format specified\n");
		badusage();
	}

done:
	return cmdopts;
}